

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

PackageSymbol * __thiscall
slang::ast::Compilation::getPackage(Compilation *this,string_view lookupName)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  uint uVar5;
  byte bVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  byte bVar10;
  size_t __n;
  char *__s1;
  int iVar11;
  uint uVar12;
  uint64_t uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  size_type __rlen;
  undefined1 auVar18 [16];
  size_t pos;
  value_type *elements;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40._M_str = lookupName._M_str;
  local_40._M_len = lookupName._M_len;
  uVar13 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      &this->packageMap,&local_40);
  __s1 = local_40._M_str;
  __n = local_40._M_len;
  uVar15 = uVar13 >> ((byte)(this->packageMap).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
                            .arrays.groups_size_index & 0x3f);
  pgVar2 = (this->packageMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
           .arrays.groups_;
  lVar16 = (uVar13 & 0xff) * 4;
  uVar7 = (&UNK_0047072c)[lVar16];
  uVar8 = (&UNK_0047072d)[lVar16];
  uVar9 = (&UNK_0047072e)[lVar16];
  bVar10 = (&UNK_0047072f)[lVar16];
  ppVar3 = (this->packageMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
           .arrays.elements_;
  uVar4 = (this->packageMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
          .arrays.groups_size_mask;
  uVar17 = 0;
  do {
    pgVar1 = pgVar2 + uVar15;
    bVar6 = pgVar1->m[0xf].n;
    auVar18[0] = -(pgVar1->m[0].n == uVar7);
    auVar18[1] = -(pgVar1->m[1].n == uVar8);
    auVar18[2] = -(pgVar1->m[2].n == uVar9);
    auVar18[3] = -(pgVar1->m[3].n == bVar10);
    auVar18[4] = -(pgVar1->m[4].n == uVar7);
    auVar18[5] = -(pgVar1->m[5].n == uVar8);
    auVar18[6] = -(pgVar1->m[6].n == uVar9);
    auVar18[7] = -(pgVar1->m[7].n == bVar10);
    auVar18[8] = -(pgVar1->m[8].n == uVar7);
    auVar18[9] = -(pgVar1->m[9].n == uVar8);
    auVar18[10] = -(pgVar1->m[10].n == uVar9);
    auVar18[0xb] = -(pgVar1->m[0xb].n == bVar10);
    auVar18[0xc] = -(pgVar1->m[0xc].n == uVar7);
    auVar18[0xd] = -(pgVar1->m[0xd].n == uVar8);
    auVar18[0xe] = -(pgVar1->m[0xe].n == uVar9);
    auVar18[0xf] = -(bVar6 == bVar10);
    for (uVar12 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe); uVar12 != 0;
        uVar12 = uVar12 - 1 & uVar12) {
      uVar5 = 0;
      if (uVar12 != 0) {
        for (; (uVar12 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar14 = (ulong)uVar5;
      if ((__n == ppVar3[uVar15 * 0xf + uVar14].first._M_len) &&
         ((__n == 0 ||
          (iVar11 = bcmp(__s1,ppVar3[uVar15 * 0xf + uVar14].first._M_str,__n), iVar11 == 0)))) {
        return ppVar3[uVar15 * 0xf + uVar14].second;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar13 & 7] & bVar6) == 0) {
      return (PackageSymbol *)0x0;
    }
    lVar16 = uVar15 + uVar17;
    uVar17 = uVar17 + 1;
    uVar15 = lVar16 + 1U & uVar4;
  } while (uVar17 <= uVar4);
  return (PackageSymbol *)0x0;
}

Assistant:

const PackageSymbol* Compilation::getPackage(std::string_view lookupName) const {
    auto it = packageMap.find(lookupName);
    if (it == packageMap.end())
        return nullptr;
    return it->second;
}